

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::SelectorSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x88) {
    if ((kind != AscendingRangeSelect) && (kind != BitSelect)) {
      return false;
    }
  }
  else if ((kind != DescendingRangeSelect) && (kind != SimpleRangeSelect)) {
    return false;
  }
  return true;
}

Assistant:

bool SelectorSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AscendingRangeSelect:
        case SyntaxKind::BitSelect:
        case SyntaxKind::DescendingRangeSelect:
        case SyntaxKind::SimpleRangeSelect:
            return true;
        default:
            return false;
    }
}